

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

const_iterator * __thiscall
ft::mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::find
          (const_iterator *__return_storage_ptr__,
          mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          key_type *k)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  treeNode<ft::pair<const_int,_int>_> **pptVar5;
  node *n;
  
  pptVar5 = &(this->
             super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             ).m_tree.m_root;
  do {
    n = *pptVar5;
    do {
      bVar3 = treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
              ::validNode(&this->
                           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                          ,n);
      if (!bVar3) {
        n = (this->
            super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            ).m_tree.m_last;
LAB_0010bb11:
        (__return_storage_ptr__->
        super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
        ).m_tree = &(this->
                    super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                    ).m_tree;
        (__return_storage_ptr__->
        super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
        ).m_node = n;
        (__return_storage_ptr__->
        super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
        )._vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113cd8;
        return __return_storage_ptr__;
      }
      iVar1 = (n->value).first;
      iVar2 = *k;
      if (iVar2 == iVar1) goto LAB_0010bb11;
      if (iVar2 != iVar1 && iVar1 <= iVar2) {
        lVar4 = 0x18;
        break;
      }
      lVar4 = 0x10;
    } while (iVar1 <= iVar2);
    pptVar5 = (treeNode<ft::pair<const_int,_int>_> **)((long)&(n->value).first + lVar4);
  } while( true );
}

Assistant:

const_iterator	find(key_type const & k) const
	{
		node*	node = this->root();
		while (this->validNode(node))
		{
			if (this->equal(node->value.first, k)) return const_iterator(this->m_tree, node);
			else if (this->key_comp()(node->value.first, k)) node = node->right;
			else if (this->key_comp()(k, node->value.first)) node = node->left;
		}
		return this->end();
	}